

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O1

DOMElement * __thiscall
xercesc_4_0::DOMElementImpl::getFirstElementChild(DOMElementImpl *this,DOMNode *n)

{
  bool bVar1;
  int iVar2;
  DOMNode *pDVar3;
  DOMNode *pDVar4;
  DOMNode *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pDVar5 = n;
  do {
    if (pDVar5 == (DOMNode *)0x0) {
      return (DOMElement *)0x0;
    }
    iVar2 = (*((DOMNode *)&pDVar5->_vptr_DOMNode)->_vptr_DOMNode[4])(pDVar5);
    if (iVar2 == 1) {
      return (DOMElement *)pDVar5;
    }
    iVar2 = (*((DOMNode *)&pDVar5->_vptr_DOMNode)->_vptr_DOMNode[7])(pDVar5);
    pDVar3 = (DOMNode *)CONCAT44(extraout_var,iVar2);
    bVar1 = pDVar5 == n || pDVar3 != (DOMNode *)0x0;
    if (pDVar5 != n && pDVar3 == (DOMNode *)0x0) {
      do {
        iVar2 = (*((DOMNode *)&pDVar5->_vptr_DOMNode)->_vptr_DOMNode[10])(pDVar5);
        pDVar4 = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
        if (pDVar4 == (DOMNode *)0x0) {
          iVar2 = (*((DOMNode *)&pDVar5->_vptr_DOMNode)->_vptr_DOMNode[5])(pDVar5);
          pDVar5 = (DOMNode *)CONCAT44(extraout_var_01,iVar2);
          pDVar3 = pDVar5;
          if ((pDVar5 == (DOMNode *)0x0) || (pDVar5 == n)) break;
        }
        bVar1 = pDVar5 == n || pDVar4 != (DOMNode *)0x0;
        pDVar3 = pDVar4;
      } while (pDVar5 != n && pDVar4 == (DOMNode *)0x0);
    }
    pDVar5 = pDVar3;
    if (!bVar1) {
      return (DOMElement *)0x0;
    }
  } while( true );
}

Assistant:

DOMElement* DOMElementImpl::getFirstElementChild(const DOMNode* n) const
{
    const DOMNode* top = n;
    while (n != NULL) {
        if (n->getNodeType() == DOMNode::ELEMENT_NODE) {
            return (DOMElement*) n;
        }
        DOMNode* next = n->getFirstChild();
        while (next == NULL) {
            if (top == n) {
                break;
            }
            next = n->getNextSibling();
            if (next == NULL) {
                n = n->getParentNode();
                if (n == NULL || top == n) {
                    return NULL;
                }
            }
        }
        n = next;
    }
    return NULL;
}